

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_FindFloorCeiling(AActor *actor,int flags)

{
  sector_t *psVar1;
  bool bVar2;
  FBoundingBox *box;
  double dVar3;
  undefined1 local_1c0 [7];
  bool usetmf;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FPortalGroupArray grouplist;
  DVector3 local_c8;
  undefined1 local_b0 [8];
  FCheckPosition tmf;
  int flags_local;
  AActor *actor_local;
  
  tmf.PushTime = flags;
  FCheckPosition::FCheckPosition((FCheckPosition *)local_b0,false);
  local_b0 = (undefined1  [8])actor;
  AActor::Pos(&local_c8,actor);
  TVector3<double>::operator=((TVector3<double> *)&tmf,&local_c8);
  if ((tmf.PushTime & 1U) != 0) {
    tmf.PushTime = tmf.PushTime | 8;
  }
  if ((tmf.PushTime & 2U) != 0) {
    tmf.pos.Z = (double)actor->Sector;
  }
  P_GetFloorCeilingZ((FCheckPosition *)local_b0,tmf.PushTime);
  if (*(sector_t **)((long)local_b0 + 0x110) == (sector_t *)0x0) {
    __assert_fail("tmf.thing->Sector != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                  ,0xf8,"void P_FindFloorCeiling(AActor *, int)");
  }
  actor->floorz = (double)tmf.sector;
  actor->dropoffz = tmf.ceilingz;
  actor->ceilingz = tmf.floorz;
  (actor->floorpic).texnum = tmf.dropoffz._0_4_;
  actor->floorterrain = tmf.dropoffz._4_4_;
  actor->floorsector = (sector_t *)tmf._64_8_;
  (actor->ceilingpic).texnum = (int)tmf.floorsector;
  actor->ceilingsector = (sector_t *)tmf._80_8_;
  if ((ffcf_verbose & 1U) != 0) {
    Printf("Starting with ceilingz = %f, floorz = %f\n",tmf.floorz,tmf.sector);
  }
  tmf.ceilingsector._0_1_ = 0;
  tmf.ceilingsector._1_1_ = 0;
  validcount = validcount + 1;
  FPortalGroupArray::FPortalGroupArray((FPortalGroupArray *)(mit.bbox.m_Box + 3),1);
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            ((FMultiBlockLinesIterator *)&cres.portalflags,(FPortalGroupArray *)(mit.bbox.m_Box + 3)
             ,actor,-1.0);
  FMultiBlockLinesIterator::CheckResult::CheckResult((CheckResult *)local_1c0);
  if (actor->floorsector == actor->Sector) {
    FMultiBlockLinesIterator::StopDown((FMultiBlockLinesIterator *)&cres.portalflags);
  }
  if (actor->ceilingsector == actor->Sector) {
    FMultiBlockLinesIterator::StopUp((FMultiBlockLinesIterator *)&cres.portalflags);
  }
  while (bVar2 = FMultiBlockLinesIterator::Next
                           ((FMultiBlockLinesIterator *)&cres.portalflags,(CheckResult *)local_1c0),
        psVar1 = tmf.sector, bVar2) {
    box = FMultiBlockLinesIterator::Box((FMultiBlockLinesIterator *)&cres.portalflags);
    PIT_FindFloorCeiling
              ((FMultiBlockLinesIterator *)&cres.portalflags,(CheckResult *)local_1c0,box,
               (FCheckPosition *)local_b0,tmf.PushTime | cres.Position.Z._0_4_);
  }
  if (((byte)tmf.ceilingsector & 1) != 0) {
    tmf.ceilingz = (double)tmf.sector;
  }
  bVar2 = true;
  if (((tmf.PushTime & 1U) != 0) && (bVar2 = false, (tmf.ceilingsector._1_1_ & 1) != 0)) {
    dVar3 = AActor::Z(actor);
    bVar2 = (double)psVar1 <= dVar3;
  }
  if ((bVar2) || (*(int *)(tmf._64_8_ + 0x1f8) != actor->Sector->PortalGroup)) {
    actor->floorz = (double)tmf.sector;
    actor->dropoffz = tmf.ceilingz;
    (actor->floorpic).texnum = tmf.dropoffz._0_4_;
    actor->floorterrain = tmf.dropoffz._4_4_;
    actor->floorsector = (sector_t *)tmf._64_8_;
  }
  if ((bVar2) || (*(int *)(tmf._80_8_ + 0x1f8) != actor->Sector->PortalGroup)) {
    actor->ceilingz = tmf.floorz;
    (actor->ceilingpic).texnum = (int)tmf.floorsector;
    actor->ceilingsector = (sector_t *)tmf._80_8_;
  }
  FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(mit.bbox.m_Box + 3));
  FCheckPosition::~FCheckPosition((FCheckPosition *)local_b0);
  return;
}

Assistant:

void P_FindFloorCeiling(AActor *actor, int flags)
{
	FCheckPosition tmf;

	tmf.thing = actor;
	tmf.pos = actor->Pos();

	if (flags & FFCF_ONLYSPAWNPOS)
	{
		flags |= FFCF_3DRESTRICT;
	}
	if (flags & FFCF_SAMESECTOR)
	{
		tmf.sector = actor->Sector;
	}
	P_GetFloorCeilingZ(tmf, flags);
	assert(tmf.thing->Sector != NULL);

	actor->floorz = tmf.floorz;
	actor->dropoffz = tmf.dropoffz;
	actor->ceilingz = tmf.ceilingz;
	actor->floorpic = tmf.floorpic;
	actor->floorterrain = tmf.floorterrain;
	actor->floorsector = tmf.floorsector;
	actor->ceilingpic = tmf.ceilingpic;
	actor->ceilingsector = tmf.ceilingsector;
	if (ffcf_verbose) Printf("Starting with ceilingz = %f, floorz = %f\n", tmf.ceilingz, tmf.floorz);

	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	validcount++;

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, actor);
	FMultiBlockLinesIterator::CheckResult cres;

	// if we already have a valid floor/ceiling sector within the current sector, 
	// we do not need to iterate through plane portals to find a floor or ceiling.
	if (actor->floorsector == actor->Sector) mit.StopDown();
	if (actor->ceilingsector == actor->Sector) mit.StopUp();

	while ((mit.Next(&cres)))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, flags|cres.portalflags);
	}

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	bool usetmf = !(flags & FFCF_ONLYSPAWNPOS) || (tmf.abovemidtex && (tmf.floorz <= actor->Z()));

	// when actual floor or ceiling are beyond a portal plane we also need to use the result of the blockmap iterator, regardless of the flags being specified.
	if (usetmf || tmf.floorsector->PortalGroup != actor->Sector->PortalGroup)
	{
		actor->floorz = tmf.floorz;
		actor->dropoffz = tmf.dropoffz;
		actor->floorpic = tmf.floorpic;
		actor->floorterrain = tmf.floorterrain;
		actor->floorsector = tmf.floorsector;
	}

	if (usetmf || tmf.ceilingsector->PortalGroup != actor->Sector->PortalGroup)
	{
		actor->ceilingz = tmf.ceilingz;
		actor->ceilingpic = tmf.ceilingpic;
		actor->ceilingsector = tmf.ceilingsector;
	}
}